

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

object_ptr __thiscall mjs::global_object::validate_object(global_object *this,value *v)

{
  gc_heap_ptr_untyped *p;
  native_error_exception *this_00;
  value *in_RDX;
  undefined8 extraout_RDX;
  object_ptr oVar1;
  wstring_view local_1f8;
  wchar_t *local_1e8;
  size_t local_1e0;
  wstring local_1c8;
  wstring_view local_1a8;
  wostringstream woss;
  
  if (in_RDX->type_ == object) {
    p = &value::object_value(in_RDX)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this,p);
    oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
    return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
  debug_print((wostream *)&woss,in_RDX,2,1,0);
  std::operator<<((wostream *)&woss," is not an object");
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_1c8,(global_object *)v);
  local_1f8._M_len = local_1c8._M_string_length;
  local_1f8._M_str = local_1c8._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1a8._M_len = local_1e0;
  local_1a8._M_str = local_1e8;
  native_error_exception::native_error_exception(this_00,type,&local_1f8,&local_1a8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

object_ptr global_object::validate_object(const value& v) const {
    if (v.type() == value_type::object) {
        return v.object_value();
    }
    std::wostringstream woss;
    mjs::debug_print(woss, v, 2, 1);
    woss << " is not an object";
    throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
}